

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O3

size_t __thiscall Attribute::SetDataSize(Attribute *this)

{
  size_t sVar1;
  long lVar2;
  pointer pAVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  pAVar3 = (this->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
      super__Vector_impl_data._M_finish == pAVar3) {
    uVar6 = 0;
    lVar4 = 2;
  }
  else {
    lVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    do {
      sVar1 = AnyType::EncodedSize
                        ((AnyType *)((long)&(pAVar3->super_DerBase)._vptr_DerBase + lVar4));
      uVar6 = uVar6 + sVar1;
      uVar5 = uVar5 + 1;
      pAVar3 = (this->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x28;
    } while (uVar5 < (ulong)(((long)(this->attrValues).
                                    super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pAVar3 >> 3) *
                            -0x3333333333333333));
    if (uVar6 < 0x80) {
      lVar4 = 2;
    }
    else {
      lVar4 = 3;
      if ((((0xff < uVar6) && (lVar4 = 4, 0xffff < uVar6)) && (lVar4 = 5, 0xffffff < uVar6)) &&
         ((lVar4 = 6, uVar6 >> 0x20 != 0 && (lVar4 = 7, uVar6 >> 0x28 != 0)))) {
        lVar4 = (ulong)(uVar6 >> 0x30 == 0) << 3;
      }
    }
  }
  lVar2 = 2;
  uVar5 = (this->attrType).super_DerBase.cbData;
  if (((0x7f < uVar5) && (lVar2 = 3, 0xff < uVar5)) &&
     ((lVar2 = 4, 0xffff < uVar5 &&
      (((lVar2 = 5, 0xffffff < uVar5 && (lVar2 = 6, uVar5 >> 0x20 != 0)) &&
       (lVar2 = 7, uVar5 >> 0x28 != 0)))))) {
    lVar2 = (ulong)(uVar5 >> 0x30 == 0) << 3;
  }
  sVar1 = lVar4 + uVar6 + lVar2 + uVar5;
  (this->super_DerBase).cbData = sVar1;
  return sVar1;
}

Assistant:

virtual size_t SetDataSize() override
	{
		size_t cbNeeded = 0; // For the set byte

		// First, calculate how much is needed for the set of attrValues
		for (size_t i = 0; i < attrValues.size(); ++i)
		{
			cbNeeded += attrValues[i].EncodedSize();
		}

		cbNeeded += GetSizeBytes(cbNeeded) + 1;
		// And next, the sequence 
		cbNeeded += attrType.EncodedSize();
		return (cbData = cbNeeded);
	}